

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.h
# Opt level: O2

ScopeSlots __thiscall Js::SlotArrayVariablesWalker::GetSlotArray(SlotArrayVariablesWalker *this)

{
  WriteBarrierPtr<void> *ptr;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long in_RSI;
  
  ptr = *(WriteBarrierPtr<void> **)(in_RSI + 0x10);
  if (ptr == (WriteBarrierPtr<void> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/DiagObjectModel.h"
                                ,0x101,"(slotArray != nullptr)","slotArray != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
            ((WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *)this,ptr);
  return (ScopeSlots)(Type)this;
}

Assistant:

ScopeSlots GetSlotArray()
        {
            Field(Var) *slotArray = (Field(Var) *) instance;
            Assert(slotArray != nullptr);
            return ScopeSlots(slotArray);
        }